

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O0

bool __thiscall
trento::NucleonCommon::participate(NucleonCommon *this,NucleonData *A,NucleonData *B)

{
  undefined1 auVar1 [16];
  bool bVar2;
  reference pCVar3;
  NucleonData *in_RDX;
  NucleonData *in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  NucleonCommon *this_00;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  double one_minus_prob;
  double distance_sq_1;
  Constituent *qB;
  iterator __end2;
  iterator __begin2;
  vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  *__range2;
  Constituent *qA;
  iterator __end1;
  iterator __begin1;
  vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  *__range1;
  double overlap;
  double distance_sq;
  NucleonData *in_stack_ffffffffffffff28;
  __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  *in_stack_ffffffffffffff30;
  double local_98;
  double local_90;
  double local_88;
  reference local_80;
  NucleonData *in_stack_ffffffffffffff88;
  __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  local_50;
  vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  *local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  NucleonData *local_20;
  NucleonData *local_18;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = NucleonData::is_participant(in_RSI);
  if (((bVar2) && (bVar2 = NucleonData::is_participant(local_20), bVar2)) &&
     ((*(byte *)(in_RDI + 0x78) & 1) == 0)) {
    local_1 = true;
  }
  else {
    dVar4 = NucleonData::x(local_18);
    local_30 = NucleonData::x(local_20);
    local_30 = dVar4 - local_30;
    dVar4 = sqr<double>(&local_30);
    dVar5 = NucleonData::y(local_18);
    local_38 = NucleonData::y(local_20);
    local_38 = dVar5 - local_38;
    auVar6._0_8_ = sqr<double>(&local_38);
    auVar6._8_56_ = extraout_var;
    auVar8 = ZEXT1664(auVar6._0_16_);
    local_28 = dVar4 + auVar6._0_8_;
    if (local_28 <= *(double *)(in_RDI + 0x50)) {
      sample_constituent_positions
                ((NucleonCommon *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88);
      sample_constituent_positions
                ((NucleonCommon *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88);
      local_40 = 0.0;
      local_48 = &local_18->constituents_;
      local_50._M_current =
           (Constituent *)
           std::
           vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           ::begin((vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                    *)in_stack_ffffffffffffff28);
      std::
      vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>::
      end((vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           *)in_stack_ffffffffffffff28);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff30,
                                (__normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                                 *)in_stack_ffffffffffffff28), bVar2) {
        pCVar3 = __gnu_cxx::
                 __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                 ::operator*(&local_50);
        std::
        vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
        ::begin((vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 *)in_stack_ffffffffffffff28);
        std::
        vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
        ::end((vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               *)in_stack_ffffffffffffff28);
        while (bVar2 = __gnu_cxx::operator!=
                                 (in_stack_ffffffffffffff30,
                                  (__normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                                   *)in_stack_ffffffffffffff28), bVar2) {
          local_80 = __gnu_cxx::
                     __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                     ::operator*((__normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                                  *)&stack0xffffffffffffff90);
          local_90 = pCVar3->x - local_80->x;
          dVar4 = sqr<double>(&local_90);
          local_98 = pCVar3->y - local_80->y;
          auVar7._0_8_ = sqr<double>(&local_98);
          auVar7._8_56_ = extraout_var_00;
          auVar8 = ZEXT1664(auVar7._0_16_);
          local_88 = dVar4 + auVar7._0_8_;
          dVar4 = exp((local_88 * -0.25) / *(double *)(in_RDI + 0x58));
          local_40 = dVar4 + local_40;
          __gnu_cxx::
          __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
          ::operator++((__normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                        *)&stack0xffffffffffffff90);
        }
        __gnu_cxx::
        __normal_iterator<trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
        ::operator++(&local_50);
      }
      auVar1 = vcvtusi2sd_avx512f(auVar8._0_16_,*(undefined8 *)(in_RDI + 0x40));
      this_00 = (NucleonCommon *)
                exp(((-*(double *)(in_RDI + 0x68) * *(double *)(in_RDI + 0x70)) /
                    (auVar1._0_8_ * 2.0)) * local_40);
      dVar4 = random::canonical<double>();
      if (dVar4 <= (double)this_00) {
        local_1 = false;
      }
      else {
        set_participant(this_00,in_stack_ffffffffffffff28);
        set_participant(this_00,in_stack_ffffffffffffff28);
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline bool NucleonCommon::participate(NucleonData& A, NucleonData& B) const {
  // If both nucleons are already participants, there's nothing to do.
  if (A.is_participant() && B.is_participant() && !calc_ncoll_)
    return true;

  auto distance_sq = sqr(A.x() - B.x()) + sqr(A.y() - B.y());

  // Check if nucleons are out of range.
  if (distance_sq > max_impact_sq_)
    return false;

  sample_constituent_positions(A);
  sample_constituent_positions(B);

  auto overlap = 0.;
  for (const auto& qA : A.constituents_) {
    for (const auto& qB : B.constituents_) {
      auto distance_sq = sqr(qA.x - qB.x) + sqr(qA.y - qB.y);
      overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
    }
  }

  // The probability is
  //   P = 1 - exp(...)
  // which we could sample as
  //   P > U
  // where U is a standard uniform (0, 1) random number.  We can also compute
  //   1 - P = exp(...)
  // and then sample
  //   (1 - P) > (1 - U)
  // or equivalently
  //   (1 - P) < U
  auto one_minus_prob = std::exp(
      -sigma_partonic_ * prefactor_/(2.*constituent_number_) * overlap
      );

  // Sample one random number and decide if this pair participates.
  if (one_minus_prob < random::canonical<double>()) {
    set_participant(A);
    set_participant(B);
    return true;
  }

  return false;
}